

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)

{
  bool bVar1;
  SQInteger SVar2;
  char *err;
  SQRESULT SVar3;
  unsigned_short tag;
  SQObjectPtr closure;
  short local_2a;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  SVar2 = (*r)(up,&local_2a,2);
  if (SVar2 == 2) {
    if (local_2a == -0x506) {
      bVar1 = SQClosure::Load(v,up,r,&local_28);
      SVar3 = -1;
      if (bVar1) {
        SQVM::Push(v,&local_28);
        SVar3 = 0;
      }
      goto LAB_00114047;
    }
    err = "invalid stream";
  }
  else {
    err = "io error";
  }
  SVar3 = -1;
  sq_throwerror(v,err);
LAB_00114047:
  SQObjectPtr::~SQObjectPtr(&local_28);
  return SVar3;
}

Assistant:

SQRESULT sq_readclosure(HSQUIRRELVM v,SQREADFUNC r,SQUserPointer up)
{
    SQObjectPtr closure;

    unsigned short tag;
    if(r(up,&tag,2) != 2)
        return sq_throwerror(v,_SC("io error"));
    if(tag != SQ_BYTECODE_STREAM_TAG)
        return sq_throwerror(v,_SC("invalid stream"));
    if(!SQClosure::Load(v,up,r,closure))
        return SQ_ERROR;
    v->Push(closure);
    return SQ_OK;
}